

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O0

IDeviceObject * __thiscall
Diligent::ResourceMappingImpl::GetResource(ResourceMappingImpl *this,Char *Name,Uint32 ArrayIndex)

{
  bool bVar1;
  Char *Message;
  pointer ppVar2;
  ResourceMappingImpl *local_b8;
  _Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
  local_88;
  ResMappingHashKey local_80;
  _Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
  local_68;
  iterator It;
  SpinLockGuard Guard;
  undefined1 local_48 [8];
  string msg;
  Uint32 ArrayIndex_local;
  Char *Name_local;
  ResourceMappingImpl *this_local;
  
  msg.field_2._12_4_ = ArrayIndex;
  if ((Name == (Char *)0x0) || (*Name == '\0')) {
    FormatString<char[31]>((string *)local_48,(char (*) [31])"Name must not be null or empty");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ResourceMappingBase.cpp"
               ,0x56);
    std::__cxx11::string::~string((string *)local_48);
    this_local = (ResourceMappingImpl *)0x0;
  }
  else {
    std::lock_guard<Threading::SpinLock>::lock_guard
              ((lock_guard<Threading::SpinLock> *)&It,&this->m_Lock);
    ResMappingHashKey::ResMappingHashKey(&local_80,Name,false,msg.field_2._12_4_);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_Diligent::HashMapStringKey::Hasher,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>_>
         ::find(&this->m_HashTable,&local_80);
    ResMappingHashKey::~ResMappingHashKey(&local_80);
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_Diligent::HashMapStringKey::Hasher,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_HashTable);
    bVar1 = std::__detail::operator!=(&local_68,&local_88);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>
                             *)&local_68);
      local_b8 = (ResourceMappingImpl *)
                 RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&ppVar2->second);
    }
    else {
      local_b8 = (ResourceMappingImpl *)0x0;
    }
    this_local = local_b8;
    std::lock_guard<Threading::SpinLock>::~lock_guard((lock_guard<Threading::SpinLock> *)&It);
  }
  return (IDeviceObject *)this_local;
}

Assistant:

IDeviceObject* ResourceMappingImpl::GetResource(const Char* Name, Uint32 ArrayIndex)
{
    if (Name == nullptr || *Name == '\0')
    {
        DEV_ERROR("Name must not be null or empty");
        return nullptr;
    }

    Threading::SpinLockGuard Guard{m_Lock};

    // Find an object with the requested name
    auto It = m_HashTable.find(ResMappingHashKey{Name, false, ArrayIndex});
    return It != m_HashTable.end() ? It->second.RawPtr() : nullptr;
}